

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void * __thiscall
pugi::impl::anon_unknown_0::xml_allocator::allocate_memory_oob
          (xml_allocator *this,size_t size,xml_memory_page **out_page)

{
  xml_memory_page *pxVar1;
  size_t local_48;
  xml_memory_page *page;
  size_t large_allocation_threshold;
  xml_memory_page **out_page_local;
  size_t size_local;
  xml_allocator *this_local;
  
  local_48 = size;
  if (size < 0x1ff7) {
    local_48 = 0x7fd8;
  }
  pxVar1 = allocate_page(this,local_48);
  *out_page = pxVar1;
  if (pxVar1 == (xml_memory_page *)0x0) {
    this_local = (xml_allocator *)0x0;
  }
  else {
    if (size < 0x1ff7) {
      this->_root->busy_size = this->_busy_size;
      pxVar1->prev = this->_root;
      this->_root->next = pxVar1;
      this->_root = pxVar1;
      this->_busy_size = size;
    }
    else {
      if (this->_root->prev == (xml_memory_page *)0x0) {
        __assert_fail("_root->prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x2de,
                      "void *pugi::impl::(anonymous namespace)::xml_allocator::allocate_memory_oob(size_t, xml_memory_page *&)"
                     );
      }
      pxVar1->prev = this->_root->prev;
      pxVar1->next = this->_root;
      this->_root->prev->next = pxVar1;
      this->_root->prev = pxVar1;
      pxVar1->busy_size = size;
    }
    this_local = (xml_allocator *)(pxVar1 + 1);
  }
  return this_local;
}

Assistant:

PUGI__FN_NO_INLINE void* xml_allocator::allocate_memory_oob(size_t size, xml_memory_page*& out_page)
	{
		const size_t large_allocation_threshold = xml_memory_page_size / 4;

		xml_memory_page* page = allocate_page(size <= large_allocation_threshold ? xml_memory_page_size : size);
		out_page = page;

		if (!page) return 0;

		if (size <= large_allocation_threshold)
		{
			_root->busy_size = _busy_size;

			// insert page at the end of linked list
			page->prev = _root;
			_root->next = page;
			_root = page;

			_busy_size = size;
		}
		else
		{
			// insert page before the end of linked list, so that it is deleted as soon as possible
			// the last page is not deleted even if it's empty (see deallocate_memory)
			assert(_root->prev);

			page->prev = _root->prev;
			page->next = _root;

			_root->prev->next = page;
			_root->prev = page;

			page->busy_size = size;
		}

		return reinterpret_cast<char*>(page) + sizeof(xml_memory_page);
	}